

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.h
# Opt level: O0

void __thiscall
IR::PropertySymOpnd::SetObjTypeSpecFldInfo
          (PropertySymOpnd *this,ObjTypeSpecFldInfo *objTypeSpecFldInfo)

{
  bool bVar1;
  uint16 uVar2;
  ObjTypeSpecFldInfo *objTypeSpecFldInfo_local;
  PropertySymOpnd *this_local;
  
  this->objTypeSpecFldInfo = objTypeSpecFldInfo;
  if (objTypeSpecFldInfo == (ObjTypeSpecFldInfo *)0x0) {
    this->field_0x61 = this->field_0x61 & 0xfe;
    this->slotIndex = 0;
  }
  else {
    bVar1 = ObjTypeSpecFldInfo::UsesAuxSlot(objTypeSpecFldInfo);
    this->field_0x61 = this->field_0x61 & 0xfe | bVar1;
    uVar2 = ObjTypeSpecFldInfo::GetSlotIndex(objTypeSpecFldInfo);
    this->slotIndex = uVar2;
  }
  return;
}

Assistant:

void SetObjTypeSpecFldInfo(ObjTypeSpecFldInfo *const objTypeSpecFldInfo)
    {
        this->objTypeSpecFldInfo = objTypeSpecFldInfo;

        // The following information may change in a flow-based manner, and an ObjTypeSpecFldInfo is shared among several
        // PropertySymOpnds, so copy the information to the opnd
        if(!objTypeSpecFldInfo)
        {
            usesAuxSlot = false;
            slotIndex = 0;
            return;
        }
        usesAuxSlot = objTypeSpecFldInfo->UsesAuxSlot();
        slotIndex = objTypeSpecFldInfo->GetSlotIndex();
    }